

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeBuffer.cpp
# Opt level: O1

void __thiscall
cali::NodeBuffer::for_each(NodeBuffer *this,function<void_(const_cali::NodeBuffer::NodeInfo_&)> *fn)

{
  uchar *puVar1;
  ulong uVar2;
  byte bVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  cali_attr_type type;
  long lVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  NodeInfo ret;
  
  if ((this->m_count != 0) && (this->m_pos != 0)) {
    uVar10 = 0;
    uVar2 = 0;
    do {
      puVar1 = this->m_buffer;
      bVar3 = 0;
      lVar5 = 0;
      uVar8 = 0;
      do {
        if (-1 < (char)puVar1[lVar5 + uVar2]) goto LAB_00189fed;
        uVar8 = uVar8 | (ulong)(puVar1[lVar5 + uVar2] & 0x7f) << (bVar3 & 0x3f);
        lVar5 = lVar5 + 1;
        bVar3 = bVar3 + 7;
      } while (lVar5 != 9);
      lVar5 = 9;
LAB_00189fed:
      lVar9 = 0;
      do {
        if (-1 < (char)(puVar1 + lVar5 + uVar2)[lVar9 + 1]) goto LAB_0018a045;
        lVar9 = lVar9 + 1;
      } while (lVar9 != 9);
      lVar9 = 9;
LAB_0018a045:
      lVar7 = lVar5 + lVar9 + 2;
      if ((((ulong)(puVar1[lVar5 + uVar2] & 0x7f) << ((char)lVar5 * '\a' & 0x3fU) | uVar8) & 1) != 0
         ) {
        lVar6 = 0;
        do {
          if (-1 < (char)puVar1[lVar6 + lVar5 + lVar9 + uVar2 + 2]) goto LAB_0018a0b0;
          lVar6 = lVar6 + 1;
        } while (lVar6 != 9);
        lVar6 = 9;
LAB_0018a0b0:
        lVar7 = lVar7 + lVar6 + 1;
      }
      bVar3 = 0;
      lVar5 = 0;
      uVar8 = 0;
      do {
        if (-1 < (char)puVar1[lVar5 + lVar7 + uVar2]) goto LAB_0018a105;
        uVar8 = uVar8 | (ulong)(puVar1[lVar5 + lVar7 + uVar2] & 0x7f) << (bVar3 & 0x3f);
        lVar5 = lVar5 + 1;
        bVar3 = bVar3 + 7;
      } while (lVar5 != 9);
      lVar5 = 9;
LAB_0018a105:
      lVar6 = lVar5 + lVar7 + 1;
      bVar3 = 0;
      lVar9 = 0;
      uVar4 = 0;
      do {
        if (-1 < (char)puVar1[lVar9 + lVar7 + lVar5 + uVar2 + 1]) goto LAB_0018a150;
        uVar4 = uVar4 | (ulong)(puVar1[lVar9 + lVar7 + lVar5 + uVar2 + 1] & 0x7f) << (bVar3 & 0x3f);
        lVar9 = lVar9 + 1;
        bVar3 = bVar3 + 7;
      } while (lVar9 != 9);
      lVar9 = 9;
LAB_0018a150:
      uVar8 = (ulong)(puVar1[lVar5 + lVar7 + uVar2] & 0x7f) << ((char)lVar5 * '\a' & 0x3fU) | uVar8;
      uVar4 = (ulong)(puVar1[lVar9 + lVar7 + lVar5 + uVar2 + 1] & 0x7f) <<
              ((char)lVar9 * '\a' & 0x3fU) | uVar4;
      type = (cali_attr_type)uVar8;
      if (9 < uVar8) {
        type = CALI_TYPE_INV;
      }
      cali_make_variant(type,puVar1 + lVar6 + lVar9 + uVar2 + 1,uVar4);
      if (*(long *)(fn + 0x10) == 0) {
        std::__throw_bad_function_call();
      }
      (**(code **)(fn + 0x18))();
      uVar10 = uVar10 + 1;
    } while ((uVar10 < this->m_count) &&
            (uVar2 = lVar6 + lVar9 + 1 + uVar2 + uVar4, uVar2 < this->m_pos));
  }
  return;
}

Assistant:

void NodeBuffer::for_each(const std::function<void(const NodeInfo&)> fn) const
{
    size_t pos = 0;

    for (size_t i = 0; i < m_count && pos < m_pos; ++i)
        fn(::unpack_node(m_buffer + pos, &pos));
}